

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::updateIsOpaque(QWidgetPrivate *this)

{
  QWidget *this_00;
  long lVar1;
  char cVar2;
  ColorRole cr;
  QPalette *pQVar3;
  QBrush *pQVar4;
  bool opaque;
  
  setDirtyOpaqueRegion(this);
  if (this->graphicsEffect == (QGraphicsEffect *)0x0) {
    this_00 = *(QWidget **)&this->field_0x8;
    opaque = true;
    if ((this_00->data->widget_attributes & 0x110) != 0) goto LAB_002edf42;
    pQVar3 = QWidget::palette(this_00);
    lVar1 = *(long *)(*(long *)&this_00->field_0x8 + 0x78);
    if ((lVar1 != 0) && ((*(byte *)(lVar1 + 0x7c) & 0x10) != 0)) {
      cr = QWidget::backgroundRole(this_00);
      pQVar4 = QPalette::brush(pQVar3,cr);
      if ((*(int *)(*(long *)pQVar4 + 4) != 0) && (cVar2 = QBrush::isOpaque(), cVar2 != '\0'))
      goto LAB_002edf42;
    }
    if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       ((this_00->data->widget_attributes & 0x200) == 0)) {
      pQVar3 = QWidget::palette(this_00);
      pQVar4 = QPalette::brush(pQVar3,Window);
      if ((*(int *)(*(long *)pQVar4 + 4) != 0) && (cVar2 = QBrush::isOpaque(), cVar2 != '\0'))
      goto LAB_002edf42;
    }
  }
  opaque = false;
LAB_002edf42:
  setOpaque(this,opaque);
  return;
}

Assistant:

void QWidgetPrivate::updateIsOpaque()
{
    // hw: todo: only needed if opacity actually changed
    setDirtyOpaqueRegion();

#if QT_CONFIG(graphicseffect)
    if (graphicsEffect) {
        // ### We should probably add QGraphicsEffect::isOpaque at some point.
        setOpaque(false);
        return;
    }
#endif // QT_CONFIG(graphicseffect)

    Q_Q(QWidget);
    if (q->testAttribute(Qt::WA_OpaquePaintEvent) || q->testAttribute(Qt::WA_PaintOnScreen)) {
        setOpaque(true);
        return;
    }

    const QPalette &pal = q->palette();

    if (q->autoFillBackground()) {
        const QBrush &autoFillBrush = pal.brush(q->backgroundRole());
        if (autoFillBrush.style() != Qt::NoBrush && autoFillBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }

    if (q->isWindow() && !q->testAttribute(Qt::WA_NoSystemBackground)) {
        const QBrush &windowBrush = q->palette().brush(QPalette::Window);
        if (windowBrush.style() != Qt::NoBrush && windowBrush.isOpaque()) {
            setOpaque(true);
            return;
        }
    }
    setOpaque(false);
}